

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

int put_arobj(CF *cfp,stat *sb)

{
  off_t size_00;
  char *__s;
  char *pcVar1;
  size_t sVar2;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  off_t size;
  gid_t gid;
  uid_t uid;
  size_t lname;
  char *name;
  int result;
  stat *sb_local;
  CF *cfp_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  __s = ar_rname(cfp->rname);
  stat64(cfp->rname,(stat64 *)sb);
  _gid = strlen(__s);
  size._4_4_ = sb->st_uid;
  size._0_4_ = sb->st_gid;
  if (0xffff < size._4_4_) {
    size._4_4_ = 0xffff;
  }
  if (0xffff < (uint)size) {
    size._0_4_ = 0xffff;
  }
  if ((_gid < 0x11) && (pcVar1 = strchr(__s,0x20), pcVar1 == (char *)0x0)) {
    _gid = 0;
    sprintf(ar_hb,"%-16.16s%-12ld%-6u%-6u%-8o%-10lld%2s",__s,(sb->st_mtim).tv_sec,(ulong)size._4_4_,
            (ulong)(uint)size,sb->st_mode,sb->st_size,"`\n");
  }
  else {
    sprintf(ar_hb,"%s%-13d%-12ld%-6u%-6u%-8o%-10lld%2s","#1/",_gid & 0xffffffff,(sb->st_mtim).tv_sec
            ,(ulong)size._4_4_,(uint)size,CONCAT44(uVar3,sb->st_mode),sb->st_size + _gid,"`\n");
  }
  size_00 = sb->st_size;
  sVar2 = fwrite(ar_hb,1,0x3c,(FILE *)cfp->wFile);
  if (sVar2 == 0x3c) {
    if (_gid != 0) {
      sVar2 = fwrite(__s,1,_gid,(FILE *)cfp->wFile);
      if (sVar2 != _gid) {
        return -2;
      }
      ar_already_written = _gid;
    }
    cfp_local._4_4_ = copy_ar(cfp,size_00);
    ar_already_written = 0;
  }
  else {
    cfp_local._4_4_ = -1;
  }
  return cfp_local._4_4_;
}

Assistant:

static int put_arobj(CF* cfp, struct stat* sb)
{
  int result = 0;

  /* If passed an sb structure, reading a file from disk.  Get stat(2)
   * information, build a name and construct a header.  (Files are named
   * by their last component in the archive.) */
  const char* name = ar_rname(cfp->rname);
  (void)stat(cfp->rname, sb);

  /* If not truncating names and the name is too long or contains
   * a space, use extended format 1.   */
  size_t lname = strlen(name);
  uid_t uid = sb->st_uid;
  gid_t gid = sb->st_gid;
  if (uid > USHRT_MAX) {
    uid = USHRT_MAX;
  }
  if (gid > USHRT_MAX) {
    gid = USHRT_MAX;
  }
  if (lname > sizeof(ar_hdr().ar_name) || strchr(name, ' ')) {
    (void)sprintf(ar_hb, HDR1, AR_EFMT1, (int)lname, (long int)sb->st_mtime,
                  (unsigned)uid, (unsigned)gid, (unsigned)sb->st_mode,
                  (long long)sb->st_size + lname, ARFMAG);
  } else {
    lname = 0;
    (void)sprintf(ar_hb, HDR2, name, (long int)sb->st_mtime, (unsigned)uid,
                  (unsigned)gid, (unsigned)sb->st_mode, (long long)sb->st_size,
                  ARFMAG);
  }
  off_t size = sb->st_size;

  if (fwrite(ar_hb, 1, sizeof(HDR), cfp->wFile) != sizeof(HDR)) {
    return -1;
  }

  if (lname) {
    if (fwrite(name, 1, lname, cfp->wFile) != lname) {
      return -2;
    }
    ar_already_written = lname;
  }
  result = copy_ar(cfp, size);
  ar_already_written = 0;
  return result;
}